

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_max_gap(REF_GRID ref_grid,REF_DBL *max_gap)

{
  REF_MPI ref_mpi_00;
  REF_NODE pRVar1;
  REF_GEOM ref_geom_00;
  uint uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  REF_DBL local_f0;
  double local_e8;
  REF_DBL local_d0;
  double local_c8;
  REF_DBL local_b0;
  double local_a8;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL global_max;
  REF_DBL max;
  REF_DBL dist;
  REF_DBL xyz [3];
  REF_INT node;
  REF_INT geom;
  REF_GEOM ref_geom;
  REF_NODE ref_node;
  REF_MPI ref_mpi;
  REF_DBL *max_gap_local;
  REF_GRID ref_grid_local;
  
  ref_mpi_00 = ref_grid->mpi;
  pRVar1 = ref_grid->node;
  ref_geom_00 = ref_grid->geom;
  *max_gap = 0.0;
  if (ref_geom_00->model == (void *)0x0) {
    ref_grid_local._4_4_ = 0;
  }
  else {
    global_max = 0.0;
    for (xyz[2]._4_4_ = 0; xyz[2]._4_4_ < ref_geom_00->max; xyz[2]._4_4_ = xyz[2]._4_4_ + 1) {
      if ((ref_geom_00->descr[xyz[2]._4_4_ * 6] == 0) &&
         (xyz[2]._0_4_ = ref_geom_00->descr[xyz[2]._4_4_ * 6 + 5],
         ref_mpi_00->id == pRVar1->part[xyz[2]._0_4_])) {
        uVar2 = ref_egads_eval(ref_geom_00,xyz[2]._4_4_,&dist,(REF_DBL *)0x0);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x727,"ref_geom_max_gap",(ulong)uVar2,"eval xyz");
          return uVar2;
        }
        dVar3 = pow(dist - pRVar1->real[xyz[2]._0_4_ * 0xf],2.0);
        dVar4 = pow(xyz[0] - pRVar1->real[xyz[2]._0_4_ * 0xf + 1],2.0);
        dVar5 = pow(xyz[1] - pRVar1->real[xyz[2]._0_4_ * 0xf + 2],2.0);
        max = sqrt(dVar3 + dVar4 + dVar5);
        local_a8 = max;
        if (max < global_max) {
          local_a8 = global_max;
        }
        global_max = local_a8;
      }
    }
    ref_grid_local._4_4_ = ref_mpi_max(ref_mpi_00,&global_max,&ref_private_macro_code_rss_1,3);
    if (ref_grid_local._4_4_ == 0) {
      if (*max_gap <= _ref_private_macro_code_rss_1) {
        local_b0 = _ref_private_macro_code_rss_1;
      }
      else {
        local_b0 = *max_gap;
      }
      *max_gap = local_b0;
      global_max = 0.0;
      for (xyz[2]._4_4_ = 0; xyz[2]._4_4_ < ref_geom_00->max; xyz[2]._4_4_ = xyz[2]._4_4_ + 1) {
        if ((ref_geom_00->descr[xyz[2]._4_4_ * 6] == 1) &&
           (xyz[2]._0_4_ = ref_geom_00->descr[xyz[2]._4_4_ * 6 + 5],
           ref_mpi_00->id == pRVar1->part[xyz[2]._0_4_])) {
          uVar2 = ref_egads_eval(ref_geom_00,xyz[2]._4_4_,&dist,(REF_DBL *)0x0);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x735,"ref_geom_max_gap",(ulong)uVar2,"eval xyz");
            return uVar2;
          }
          dVar3 = pow(dist - pRVar1->real[xyz[2]._0_4_ * 0xf],2.0);
          dVar4 = pow(xyz[0] - pRVar1->real[xyz[2]._0_4_ * 0xf + 1],2.0);
          dVar5 = pow(xyz[1] - pRVar1->real[xyz[2]._0_4_ * 0xf + 2],2.0);
          max = sqrt(dVar3 + dVar4 + dVar5);
          local_c8 = max;
          if (max < global_max) {
            local_c8 = global_max;
          }
          global_max = local_c8;
        }
      }
      ref_grid_local._4_4_ = ref_mpi_max(ref_mpi_00,&global_max,&ref_private_macro_code_rss_1,3);
      if (ref_grid_local._4_4_ == 0) {
        if (*max_gap <= _ref_private_macro_code_rss_1) {
          local_d0 = _ref_private_macro_code_rss_1;
        }
        else {
          local_d0 = *max_gap;
        }
        *max_gap = local_d0;
        global_max = 0.0;
        for (xyz[2]._4_4_ = 0; xyz[2]._4_4_ < ref_geom_00->max; xyz[2]._4_4_ = xyz[2]._4_4_ + 1) {
          if ((ref_geom_00->descr[xyz[2]._4_4_ * 6] == 2) &&
             (xyz[2]._0_4_ = ref_geom_00->descr[xyz[2]._4_4_ * 6 + 5],
             ref_mpi_00->id == pRVar1->part[xyz[2]._0_4_])) {
            uVar2 = ref_egads_eval(ref_geom_00,xyz[2]._4_4_,&dist,(REF_DBL *)0x0);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x743,"ref_geom_max_gap",(ulong)uVar2,"eval xyz");
              return uVar2;
            }
            dVar3 = pow(dist - pRVar1->real[xyz[2]._0_4_ * 0xf],2.0);
            dVar4 = pow(xyz[0] - pRVar1->real[xyz[2]._0_4_ * 0xf + 1],2.0);
            dVar5 = pow(xyz[1] - pRVar1->real[xyz[2]._0_4_ * 0xf + 2],2.0);
            max = sqrt(dVar3 + dVar4 + dVar5);
            local_e8 = max;
            if (max < global_max) {
              local_e8 = global_max;
            }
            global_max = local_e8;
          }
        }
        ref_grid_local._4_4_ = ref_mpi_max(ref_mpi_00,&global_max,&ref_private_macro_code_rss_1,3);
        if (ref_grid_local._4_4_ == 0) {
          global_max = _ref_private_macro_code_rss_1;
          if (*max_gap <= _ref_private_macro_code_rss_1) {
            local_f0 = _ref_private_macro_code_rss_1;
          }
          else {
            local_f0 = *max_gap;
          }
          *max_gap = local_f0;
          ref_grid_local._4_4_ = ref_mpi_bcast(ref_mpi_00,max_gap,1,3);
          if (ref_grid_local._4_4_ == 0) {
            ref_grid_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x74c,"ref_geom_max_gap",(ulong)ref_grid_local._4_4_,"mpi bcast gap");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x749,"ref_geom_max_gap",(ulong)ref_grid_local._4_4_,"mpi max face");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x73b,"ref_geom_max_gap",(ulong)ref_grid_local._4_4_,"mpi max edge");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x72d,
             "ref_geom_max_gap",(ulong)ref_grid_local._4_4_,"mpi max node");
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_max_gap(REF_GRID ref_grid, REF_DBL *max_gap) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT geom;
  REF_INT node;
  REF_DBL xyz[3];
  REF_DBL dist, max, global_max;

  *max_gap = 0.0;

  if (!ref_geom_model_loaded(ref_geom)) return REF_SUCCESS;

  max = 0.0;
  each_ref_geom_node(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) continue;
    RSS(ref_egads_eval(ref_geom, geom, xyz, NULL), "eval xyz");
    dist = sqrt(pow(xyz[0] - ref_node_xyz(ref_node, 0, node), 2) +
                pow(xyz[1] - ref_node_xyz(ref_node, 1, node), 2) +
                pow(xyz[2] - ref_node_xyz(ref_node, 2, node), 2));
    max = MAX(max, dist);
  }
  RSS(ref_mpi_max(ref_mpi, &max, &global_max, REF_DBL_TYPE), "mpi max node");
  max = global_max;
  *max_gap = MAX(*max_gap, max);

  max = 0.0;
  each_ref_geom_edge(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) continue;
    RSS(ref_egads_eval(ref_geom, geom, xyz, NULL), "eval xyz");
    dist = sqrt(pow(xyz[0] - ref_node_xyz(ref_node, 0, node), 2) +
                pow(xyz[1] - ref_node_xyz(ref_node, 1, node), 2) +
                pow(xyz[2] - ref_node_xyz(ref_node, 2, node), 2));
    max = MAX(max, dist);
  }
  RSS(ref_mpi_max(ref_mpi, &max, &global_max, REF_DBL_TYPE), "mpi max edge");
  max = global_max;
  *max_gap = MAX(*max_gap, max);

  max = 0.0;
  each_ref_geom_face(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) continue;
    RSS(ref_egads_eval(ref_geom, geom, xyz, NULL), "eval xyz");
    dist = sqrt(pow(xyz[0] - ref_node_xyz(ref_node, 0, node), 2) +
                pow(xyz[1] - ref_node_xyz(ref_node, 1, node), 2) +
                pow(xyz[2] - ref_node_xyz(ref_node, 2, node), 2));
    max = MAX(max, dist);
  }
  RSS(ref_mpi_max(ref_mpi, &max, &global_max, REF_DBL_TYPE), "mpi max face");
  max = global_max;
  *max_gap = MAX(*max_gap, max);
  RSS(ref_mpi_bcast(ref_mpi, max_gap, 1, REF_DBL_TYPE), "mpi bcast gap");

  return REF_SUCCESS;
}